

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O3

void lj_func_free(global_State *g,GCfunc *fn)

{
  size_t sVar1;
  
  sVar1 = (ulong)(fn->c).nupvalues * 8 + (ulong)((fn->c).ffid != '\0') * 8 + 0x28;
  (g->gc).total = (g->gc).total - sVar1;
  (*g->allocf)(g->allocd,fn,sVar1,0);
  return;
}

Assistant:

void LJ_FASTCALL lj_func_free(global_State *g, GCfunc *fn)
{
  MSize size = isluafunc(fn) ? sizeLfunc((MSize)fn->l.nupvalues) :
			       sizeCfunc((MSize)fn->c.nupvalues);
  lj_mem_free(g, fn, size);
}